

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_patterns.c
# Opt level: O1

void test_patterns(void)

{
  wchar_t wVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  char file_a [11];
  char file_c [14];
  char file_d [17];
  char file_b2 [24];
  char file_b1 [24];
  char *tar2aExpected [3];
  char local_c8 [128];
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_38 = 0;
  local_48 = "/tmp/foo/bar/";
  pcStack_40 = "/tmp/foo/bar/baz";
  __stream = fopen("foo","w");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                   ,L'#',(uint)(__stream != (FILE *)0x0),"f != NULL",(void *)0x0);
  fclose(__stream);
  wVar1 = systemf("%s cfv tar1.tgz foo > tar1a.out 2> tar1a.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                      ,L'&',(long)wVar1,"r",0,"0",(void *)0x0);
  wVar1 = systemf("%s xv --no-same-owner -f tar1.tgz foo bar > tar1b.out 2> tar1b.err",testprog);
  failure(
         "tar should return non-zero because a file was given on the command line that\'s not in the archive"
         );
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                   ,L')',(uint)(wVar1 != L'\0'),"r != 0",(void *)0x0);
  extract_reference_file("test_patterns_2.tar");
  wVar1 = systemf("%s tf %s /tmp/foo/bar > tar2a.out 2> tar2a.err",testprog,"test_patterns_2.tar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                      ,L'2',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_file_contains_lines_any_order
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'3',"tar2a.out",&local_48);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'4',"tar2a.err");
  extract_reference_file("test_patterns_3.tar");
  wVar1 = systemf("%s x --no-same-owner -f %s tmp/foo/bar > tar3a.out 2> tar3a.err",testprog,
                  "test_patterns_3.tar");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                   ,L'>',(uint)(wVar1 != L'\0'),"r != 0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'?',"tar3a.out");
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'B',"tar3a.err");
  wVar1 = systemf("%s x --no-same-owner -f %s /tmp/foo/baz > tar3b.out 2> tar3b.err",testprog,
                  "test_patterns_3.tar");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                   ,L'F',(uint)(wVar1 != L'\0'),"r != 0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'G',"tar3b.out");
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'H',"tar3b.err");
  wVar1 = systemf("%s x --no-same-owner -f %s ./tmp/foo/bar > tar3c.out 2> tar3c.err",testprog,
                  "test_patterns_3.tar");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                   ,L'M',(uint)(wVar1 != L'\0'),"r != 0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'N',"tar3c.out");
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'O',"tar3c.err");
  wVar1 = systemf("%s x --no-same-owner -f %s ./tmp/foo/baz > tar3d.out 2> tar3d.err",testprog,
                  "test_patterns_3.tar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                      ,L'T',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'U',"tar3d.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'V',"tar3d.err");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'W',"tmp/foo/baz/bar");
  extract_reference_file("test_patterns_4.tar");
  wVar1 = systemf("%s x --no-same-owner -f %s -C tmp > tar4.out 2> tar4.err",testprog,
                  "test_patterns_4.tar");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                   ,L'a',(uint)(wVar1 != L'\0'),"r != 0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'b',"tar4.out");
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
             ,L'c',"tar4.err");
  uVar7 = 1;
  do {
    uVar6 = (uint)uVar7;
    builtin_strncpy(local_c8,"tmp/fileXX",0xb);
    builtin_strncpy(local_c8 + 0x60,"tmp/server/share/fileXX",0x18);
    builtin_strncpy(local_c8 + 0x40,"tmp/server\\share\\fileXX",0x18);
    builtin_strncpy(local_c8 + 0x10,"tmp/../fileXX",0xe);
    builtin_strncpy(local_c8 + 0x20,"tmp/../../fileXX",0x11);
    if (uVar6 < 0x35) {
      iVar2 = 0x18;
      if ((0x10004800000000U >> (uVar7 & 0x3f) & 1) == 0) {
        pcVar3 = local_c8 + 0x60;
        if ((0x48000UL >> (uVar7 & 0x3f) & 1) == 0) goto LAB_00116ae1;
      }
      else {
        pcVar3 = local_c8 + 0x40;
      }
    }
    else {
LAB_00116ae1:
      iVar2 = 0xb;
      pcVar3 = local_c8;
    }
    bVar5 = (byte)(uVar7 / 10) | 0x30;
    pcVar3[iVar2 - 3] = bVar5;
    cVar4 = (char)uVar7 + (char)(uVar7 / 10) * -10 + '0';
    pcVar3[iVar2 - 2] = cVar4;
    if ((uVar6 < 0x37) && ((0x40092006120060U >> (uVar7 & 0x3f) & 1) != 0)) {
      assertion_file_not_exists
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                 ,L'\x99',pcVar3);
      if (uVar6 < 0x2c) {
        iVar2 = 0x11;
        pcVar3 = local_c8 + 0x20;
        if ((0x80004000040U >> (uVar7 & 0x3f) & 1) == 0) goto LAB_00116b6a;
      }
      else {
LAB_00116b6a:
        iVar2 = 0xe;
        pcVar3 = local_c8 + 0x10;
      }
      pcVar3[iVar2 - 3] = bVar5;
      pcVar3[iVar2 - 2] = cVar4;
      assertion_file_not_exists
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                 ,L'£',pcVar3);
    }
    else {
      assertion_file_exists
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_patterns.c"
                 ,L'§',pcVar3);
    }
    uVar7 = (ulong)(uVar6 + 1);
    if (uVar6 + 1 == 0x37) {
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(test_patterns)
{
	FILE *f;
	int r;
	const char *reffile2 = "test_patterns_2.tar";
	const char *reffile3 = "test_patterns_3.tar";
	const char *reffile4 = "test_patterns_4.tar";

	const char *tar2aExpected[] = {
		"/tmp/foo/bar/",
		"/tmp/foo/bar/baz",
		NULL
	};

	/*
	 * Test basic command-line pattern handling.
	 */

	/*
	 * Test 1: Files on the command line that don't get matched
	 * didn't produce an error.
	 *
	 * John Baldwin reported this problem in PR bin/121598
	 */
	f = fopen("foo", "w");
	assert(f != NULL);
	fclose(f);
	r = systemf("%s cfv tar1.tgz foo > tar1a.out 2> tar1a.err", testprog);
	assertEqualInt(r, 0);
	r = systemf("%s xv --no-same-owner -f tar1.tgz foo bar > tar1b.out 2> tar1b.err", testprog);
	failure("tar should return non-zero because a file was given on the command line that's not in the archive");
	assert(r != 0);

	/*
	 * Test 2: Check basic matching of full paths that start with /
	 */
	extract_reference_file(reffile2);

	r = systemf("%s tf %s /tmp/foo/bar > tar2a.out 2> tar2a.err",
	    testprog, reffile2);
	assertEqualInt(r, 0);
	assertFileContainsLinesAnyOrder("tar2a.out", tar2aExpected);
	assertEmptyFile("tar2a.err");

	/*
	 * Test 3 archive has some entries starting with '/' and some not.
	 */
	extract_reference_file(reffile3);

	/* Test 3a:  Pattern tmp/foo/bar should not match /tmp/foo/bar */
	r = systemf("%s x --no-same-owner -f %s tmp/foo/bar > tar3a.out 2> tar3a.err",
	    testprog, reffile3);
	assert(r != 0);
	assertEmptyFile("tar3a.out");

	/* Test 3b:  Pattern /tmp/foo/baz should not match tmp/foo/baz */
	assertNonEmptyFile("tar3a.err");
	/* Again, with the '/' */
	r = systemf("%s x --no-same-owner -f %s /tmp/foo/baz > tar3b.out 2> tar3b.err",
	    testprog, reffile3);
	assert(r != 0);
	assertEmptyFile("tar3b.out");
	assertNonEmptyFile("tar3b.err");

	/* Test 3c: ./tmp/foo/bar should not match /tmp/foo/bar */
	r = systemf("%s x --no-same-owner -f %s ./tmp/foo/bar > tar3c.out 2> tar3c.err",
	    testprog, reffile3);
	assert(r != 0);
	assertEmptyFile("tar3c.out");
	assertNonEmptyFile("tar3c.err");

	/* Test 3d: ./tmp/foo/baz should match tmp/foo/baz */
	r = systemf("%s x --no-same-owner -f %s ./tmp/foo/baz > tar3d.out 2> tar3d.err",
	    testprog, reffile3);
	assertEqualInt(r, 0);
	assertEmptyFile("tar3d.out");
	assertEmptyFile("tar3d.err");
	assertFileExists("tmp/foo/baz/bar");

	/*
	 * Test 4 archive has some entries starting with windows drive letters
	 * such as 'c:\', '//./c:/' or '//?/c:/'.
	 */
	extract_reference_file(reffile4);

	r = systemf("%s x --no-same-owner -f %s -C tmp > tar4.out 2> tar4.err",
	    testprog, reffile4);
	assert(r != 0);
	assertEmptyFile("tar4.out");
	assertNonEmptyFile("tar4.err");

	for (r = 1; r <= 54; r++) {
		char file_a[] = "tmp/fileXX";
		char file_b1[] = "tmp/server/share/fileXX";
		char file_b2[] = "tmp/server\\share\\fileXX";
		char file_c[] = "tmp/../fileXX";
		char file_d[] = "tmp/../../fileXX";
		char *filex;
		int xsize;

		switch (r) {
		case 15: case 18:
			/*
			 * Including server and share names.
			 * //?/UNC/server/share/file15
			 * //?/unc/server/share/file18
			 */
			filex = file_b1;
			xsize = sizeof(file_b1);
			break;
		case 35: case 38: case 52:
			/*
			 * Including server and share names.
			 * \\?\UNC\server\share\file35
			 * \\?\unc\server\share\file38
			 * \/?/uNc/server\share\file52
			 */
			filex = file_b2;
			xsize = sizeof(file_b2);
			break;
		default:
			filex = file_a;
			xsize = sizeof(file_a);
			break;
		}
		filex[xsize-3] = '0' + r / 10;
		filex[xsize-2] = '0' + r % 10;
		switch (r) {
		case 5: case 6: case 17: case 20: case 25:
		case 26: case 37: case 40: case 43: case 54:
			/*
			 * Not extracted patterns.
			 * D:../file05
			 * c:../../file06
			 * //?/UNC/../file17
			 * //?/unc/../file20
			 * z:..\file25
			 * c:..\..\file26
			 * \\?\UNC\..\file37
			 * \\?\unc\..\file40
			 * c:../..\file43
			 * \/?\UnC\../file54
			 */
			assertFileNotExists(filex);
			if (r == 6 || r == 26 || r == 43) {
				filex = file_d;
				xsize = sizeof(file_d);
			} else {
				filex = file_c;
				xsize = sizeof(file_c);
			}
			filex[xsize-3] = '0' + r / 10;
			filex[xsize-2] = '0' + r % 10;
			assertFileNotExists(filex);
			break;
		default:
			/* Extracted patterns. */
			assertFileExists(filex);
			break;
		}
	}
}